

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blanczos.cpp
# Opt level: O3

uint32_t blanczos(uint32_t *B,uint64_t N,uint32_t Nrow,uint32_t Ncol,uint64_t *result)

{
  ulong *puVar1;
  uchar uVar2;
  undefined1 uVar3;
  unsigned_long uVar4;
  ulong uVar5;
  byte bVar6;
  uint uVar7;
  unsigned_long uVar8;
  unsigned_long uVar9;
  unsigned_long uVar10;
  unsigned_long uVar11;
  unsigned_long uVar12;
  unsigned_long uVar13;
  result_type *prVar14;
  pointer puVar15;
  pointer puVar16;
  undefined1 auVar17 [64];
  int iVar18;
  uint32_t nthreads;
  uint uVar19;
  uint64_t *elem_1;
  long lVar20;
  result_type rVar21;
  ostream *poVar22;
  undefined8 *puVar23;
  _anonymous_namespace_ *p_Var24;
  void *__s;
  pointer puVar25;
  ulong uVar26;
  ulong uVar27;
  uint uVar28;
  uint64_t uVar29;
  uint32_t uVar30;
  size_type __n;
  long lVar31;
  ulong uVar32;
  unsigned_long *puVar33;
  ulong uVar34;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar35;
  void *pvVar36;
  uint32_t vec;
  pointer puVar37;
  uint64_t *elem;
  result_type *prVar38;
  bool bVar39;
  ulong uVar40;
  ulong uVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar82 [32];
  undefined8 uVar83;
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [64];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  vec64 work1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vectors;
  vec64 X;
  vec64 AV0;
  vec64 workV;
  vec64 Q;
  vec64 result_1;
  vec64 work2;
  uniform_int_distribution<unsigned_long> dis;
  sparse matrix;
  arr64 D;
  array<unsigned_int,_64UL> temp;
  arr64 T0;
  arr64 W0i;
  arr64 W1i;
  arr64 T1;
  arr64 F;
  arr64 E;
  arr64 G;
  arr64 W2i;
  mt19937_64 gen;
  random_device rd;
  allocator_type local_32b9;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_32b8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_3298;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_3278;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_3260;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_3248;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_3228;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_3210;
  undefined1 local_31f8 [32];
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_31d8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_31c0;
  ulong local_31a8;
  result_type *local_31a0;
  result_type *local_3198;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_3190;
  value_type_conflict2 local_3178;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_3170;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_3158;
  uint64_t *local_3140;
  uint32_t local_3138;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_3130;
  uniform_int_distribution<unsigned_long> local_3118;
  sparse local_3108;
  arr64 local_3088;
  undefined8 local_2e88;
  undefined8 uStack_2e80;
  undefined8 uStack_2e78;
  undefined8 uStack_2e70;
  undefined8 local_2e68;
  undefined8 uStack_2e60;
  undefined8 uStack_2e58;
  undefined8 uStack_2e50;
  undefined8 local_2e48;
  undefined8 uStack_2e40;
  undefined8 uStack_2e38;
  undefined8 uStack_2e30;
  undefined8 local_2e28;
  undefined8 uStack_2e20;
  undefined8 uStack_2e18;
  undefined8 uStack_2e10;
  undefined8 local_2e08;
  undefined8 uStack_2e00;
  undefined8 uStack_2df8;
  undefined8 uStack_2df0;
  undefined8 local_2de8;
  undefined8 uStack_2de0;
  undefined8 uStack_2dd8;
  undefined8 uStack_2dd0;
  undefined8 local_2dc8;
  undefined8 uStack_2dc0;
  undefined8 uStack_2db8;
  undefined8 uStack_2db0;
  undefined8 local_2da8;
  undefined8 uStack_2da0;
  undefined8 uStack_2d98;
  undefined8 uStack_2d90;
  arr64 local_2d80;
  array<unsigned_long,_64UL> local_2b80;
  arr64 local_2980;
  array<unsigned_long,_64UL> local_2780;
  array<unsigned_long,_64UL> local_2580;
  array<unsigned_long,_64UL> local_2380;
  arr64 local_2180;
  array<unsigned_long,_64UL> local_1f80;
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  local_1d80;
  random_device local_13b8;
  undefined1 auVar54 [32];
  undefined1 auVar53 [32];
  undefined1 auVar62 [32];
  undefined1 auVar66 [32];
  undefined1 auVar69 [32];
  undefined1 auVar72 [32];
  undefined1 auVar77 [32];
  undefined1 auVar81 [32];
  undefined1 auVar58 [32];
  
  local_3140 = result;
  iVar18 = std::thread::hardware_concurrency();
  nthreads = iVar18 + (uint)(iVar18 == 0);
  if (Ncol < Nrow + 0x40) {
    poVar22 = std::operator<<((ostream *)&std::cerr,"Ncol >= Nrow + 64 is expected.");
    std::endl<char,std::char_traits<char>>(poVar22);
    exit(0x11);
  }
  __blanczos_matrix::sparse::sparse(&local_3108,B,N,Nrow,Ncol,524288.0);
LAB_001046eb:
  std::random_device::random_device(&local_13b8);
  uVar19 = std::random_device::_M_getval();
  local_1d80._M_x[0] = (unsigned_long)uVar19;
  lVar20 = 1;
  uVar26 = local_1d80._M_x[0];
  do {
    uVar26 = (uVar26 >> 0x3e ^ uVar26) * 0x5851f42d4c957f2d + lVar20;
    local_1d80._M_x[lVar20] = uVar26;
    lVar20 = lVar20 + 1;
  } while (lVar20 != 0x138);
  local_1d80._M_p = 0x138;
  local_3118._M_param._M_a = 0;
  local_3118._M_param._M_b = 0xffffffffffffffff;
  local_2d80._M_elems[0] = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_3228,(ulong)local_3108.Kcols,local_2d80._M_elems,(allocator_type *)&local_2780);
  puVar25 = local_3228.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish;
  prVar14 = local_3228.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start;
  for (prVar38 = local_3228.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start; prVar38 != puVar25; prVar38 = prVar38 + 1
      ) {
    rVar21 = std::uniform_int_distribution<unsigned_long>::operator()
                       (&local_3118,&local_1d80,&local_3118._M_param);
    *prVar38 = rVar21;
    prVar14 = local_3228.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish;
  }
  __n = (long)prVar14 -
        (long)local_3228.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start >> 3;
  if (__n != local_3108.Kcols) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"X should have size matrix.Kcol().",0x21);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
    exit(0xb);
  }
  local_31a8 = (ulong)local_3108.Ncols;
  uVar26 = (ulong)local_3108.Krows;
  local_2d80._M_elems[0] = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_3190,__n,local_2d80._M_elems,(allocator_type *)&local_2780);
  local_2d80._M_elems[0] = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_32b8,__n,local_2d80._M_elems,(allocator_type *)&local_2780);
  local_2d80._M_elems[0] = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_3248,__n,local_2d80._M_elems,(allocator_type *)&local_2780);
  local_2d80._M_elems[0] = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_31d8,__n,local_2d80._M_elems,(allocator_type *)&local_2780);
  local_2d80._M_elems[0] = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_3210,__n,local_2d80._M_elems,(allocator_type *)&local_2780);
  local_2d80._M_elems[0] = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_3298,__n,local_2d80._M_elems,(allocator_type *)&local_2780);
  local_2d80._M_elems[0] = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_31c0,__n,local_2d80._M_elems,(allocator_type *)&local_2780);
  local_2d80._M_elems[0] = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_3278,uVar26,local_2d80._M_elems,(allocator_type *)&local_2780);
  local_2d80._M_elems[0] = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_3158,uVar26,local_2d80._M_elems,(allocator_type *)&local_2780);
  memset(&local_2d80,0,0x200);
  memset((allocator_type *)&local_2780,0,0x200);
  memset(&local_2b80,0,0x200);
  memset(&local_2980,0,0x200);
  memset(&local_1f80,0,0x200);
  memset(&local_2180,0,0x200);
  memset(&local_2580,0,0x200);
  memset(&local_2380,0,0x200);
  memset(&local_3088,0,0x200);
  local_2da8 = 0;
  uStack_2da0 = 0;
  uStack_2d98 = 0;
  uStack_2d90 = 0;
  local_2dc8 = 0;
  uStack_2dc0 = 0;
  uStack_2db8 = 0;
  uStack_2db0 = 0;
  local_2de8 = 0;
  uStack_2de0 = 0;
  uStack_2dd8 = 0;
  uStack_2dd0 = 0;
  local_2e08 = 0;
  uStack_2e00 = 0;
  uStack_2df8 = 0;
  uStack_2df0 = 0;
  local_2e28 = 0;
  uStack_2e20 = 0;
  uStack_2e18 = 0;
  uStack_2e10 = 0;
  local_2e48 = 0;
  uStack_2e40 = 0;
  uStack_2e38 = 0;
  uStack_2e30 = 0;
  local_2e68 = 0;
  uStack_2e60 = 0;
  uStack_2e58 = 0;
  uStack_2e50 = 0;
  local_2e88 = 0;
  uStack_2e80 = 0;
  uStack_2e78 = 0;
  uStack_2e70 = 0;
  __blanczos_matrix::sparse::multiply_regular(&local_3108,&local_3278,&local_3228,nthreads);
  __blanczos_matrix::sparse::multiply_transpose(&local_3108,&local_3190,&local_3278,nthreads);
  if ((long)local_3190.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_3190.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != 0) {
    memmove(local_32b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start,
            local_3190.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start,
            (long)local_3190.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)local_3190.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start);
  }
  __blanczos_matrix::sparse::multiply_regular(&local_3108,&local_3278,&local_32b8,nthreads);
  __blanczos_matrix::sparse::multiply_transpose(&local_3108,&local_3210,&local_3278,nthreads);
  puVar16 = local_3210.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start;
  puVar15 = local_32b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish;
  puVar25 = local_32b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start;
  memset(&local_2d80,0,0x200);
  lVar20 = (long)puVar15 - (long)puVar25 >> 3;
  uVar26 = lVar20 + (ulong)(lVar20 == 0) + 3 & 0xfffffffffffffffc;
  auVar50 = vpbroadcastq_avx512vl();
  auVar43 = vpmovsxbq_avx(ZEXT216(0x4000));
  do {
    uVar83 = auVar43._0_8_;
    auVar58._8_8_ = uVar83;
    auVar58._0_8_ = uVar83;
    auVar58._16_8_ = uVar83;
    auVar58._24_8_ = uVar83;
    if (puVar15 != puVar25) {
      uVar27 = 0;
      auVar53 = vpmovsxbq_avx2(ZEXT416(0x3020100));
      auVar17 = ZEXT1664((undefined1  [16])0x0);
      do {
        auVar95 = auVar17;
        auVar51 = vpbroadcastq_avx512vl();
        auVar51 = vpor_avx2(auVar51,auVar53);
        uVar40 = vpcmpuq_avx512vl(auVar51,auVar50,2);
        uVar40 = uVar40 & 0xf;
        auVar51 = vmovdqu64_avx512vl(*(undefined1 (*) [32])((long)puVar25 + uVar27 * 8));
        bVar6 = (byte)uVar40;
        auVar52._8_8_ = (ulong)((byte)(uVar40 >> 1) & 1) * auVar51._8_8_;
        auVar52._0_8_ = (ulong)(bVar6 & 1) * auVar51._0_8_;
        auVar52._16_8_ = (ulong)((byte)(uVar40 >> 2) & 1) * auVar51._16_8_;
        auVar52._24_8_ = (uVar40 >> 3) * auVar51._24_8_;
        auVar51 = vpsllvq_avx2(auVar52,auVar58);
        auVar52 = vmovdqu64_avx512vl(*(undefined1 (*) [32])(puVar16 + uVar27));
        auVar56._8_8_ = (ulong)((byte)(uVar40 >> 1) & 1) * auVar52._8_8_;
        auVar56._0_8_ = (ulong)(bVar6 & 1) * auVar52._0_8_;
        auVar56._16_8_ = (ulong)((byte)(uVar40 >> 2) & 1) * auVar52._16_8_;
        auVar56._24_8_ = (uVar40 >> 3) * auVar52._24_8_;
        auVar51 = vpternlogq_avx512vl(auVar56,auVar95._0_32_,auVar51,0x6c);
        uVar27 = uVar27 + 4;
        auVar17 = ZEXT3264(auVar51);
      } while (uVar26 != uVar27);
      auVar53 = vmovdqa64_avx512vl(auVar51);
      auVar42._0_8_ = (ulong)(bVar6 & 1) * auVar53._0_8_ | (ulong)!(bool)(bVar6 & 1) * auVar95._0_8_
      ;
      bVar39 = (bool)((byte)(uVar40 >> 1) & 1);
      auVar42._8_8_ = (ulong)bVar39 * auVar53._8_8_ | (ulong)!bVar39 * auVar95._8_8_;
      bVar39 = (bool)((byte)(uVar40 >> 2) & 1);
      auVar51._16_8_ = (ulong)bVar39 * auVar53._16_8_ | (ulong)!bVar39 * auVar95._16_8_;
      auVar51._0_16_ = auVar42;
      auVar51._24_8_ =
           (uVar40 >> 3) * auVar53._24_8_ | (ulong)!SUB81(uVar40 >> 3,0) * auVar95._24_8_;
      vpshufd_avx(auVar42 ^ auVar51._16_16_,0xee);
    }
    lVar20 = vpextrq_avx(auVar43,1);
    auVar51 = vpbroadcastq_avx512vl();
    auVar52 = vpbroadcastq_avx512vl();
    uVar27 = 0;
    auVar53 = vpmovsxbq_avx2(ZEXT416(0x3020100));
    auVar104._8_8_ = 1;
    auVar104._0_8_ = 1;
    auVar104._16_8_ = 1;
    auVar104._24_8_ = 1;
    auVar108._8_8_ = 4;
    auVar108._0_8_ = 4;
    auVar108._16_8_ = 4;
    auVar108._24_8_ = 4;
    do {
      uVar40 = vpcmpuq_avx512vl(auVar53,auVar51,2);
      uVar40 = uVar40 & 0xf;
      auVar56 = vpaddq_avx2(auVar53,auVar58);
      auVar56 = vpsllvq_avx2(auVar104,auVar56);
      auVar54 = vmovdqu64_avx512vl(*(undefined1 (*) [32])(local_2d80._M_elems + uVar27));
      auVar55._8_8_ = (ulong)((byte)(uVar40 >> 1) & 1) * auVar54._8_8_;
      auVar55._0_8_ = (ulong)((byte)uVar40 & 1) * auVar54._0_8_;
      auVar55._16_8_ = (ulong)((byte)(uVar40 >> 2) & 1) * auVar54._16_8_;
      auVar55._24_8_ = (uVar40 >> 3) * auVar54._24_8_;
      auVar56 = vpternlogq_avx512vl(auVar55,auVar56,auVar52,0xf8);
      auVar56 = vmovdqu64_avx512vl(auVar56);
      *(undefined1 (*) [32])(local_2d80._M_elems + uVar27) = auVar56;
      uVar27 = uVar27 + 4;
      auVar53 = vpaddq_avx2(auVar108,auVar53);
    } while ((lVar20 + 3U & 0xfffffffffffffffc) != uVar27);
    auVar43 = vpaddq_avx(auVar43,_DAT_00109080);
  } while (auVar43._0_8_ != 0x40);
  lVar20 = 1;
  lVar31 = 0x42;
  puVar33 = local_2d80._M_elems;
  do {
    puVar33 = puVar33 + 1;
    if (puVar15 != puVar25) {
      auVar53 = vpbroadcastq_avx512vl();
      uVar27 = 0;
      auVar58 = vpmovsxbq_avx2(ZEXT416(0x3020100));
      auVar17 = ZEXT1664((undefined1  [16])0x0);
      do {
        auVar95 = auVar17;
        auVar51 = vpbroadcastq_avx512vl();
        auVar51 = vpor_avx2(auVar51,auVar58);
        uVar40 = vpcmpuq_avx512vl(auVar51,auVar50,2);
        uVar40 = uVar40 & 0xf;
        auVar51 = vmovdqu64_avx512vl(*(undefined1 (*) [32])((long)puVar25 + uVar27 * 8));
        bVar6 = (byte)uVar40;
        auVar54._8_8_ = (ulong)((byte)(uVar40 >> 1) & 1) * auVar51._8_8_;
        auVar54._0_8_ = (ulong)(bVar6 & 1) * auVar51._0_8_;
        auVar54._16_8_ = (ulong)((byte)(uVar40 >> 2) & 1) * auVar51._16_8_;
        auVar54._24_8_ = (uVar40 >> 3) * auVar51._24_8_;
        auVar51 = vpsrlvq_avx2(auVar54,auVar53);
        auVar52 = vmovdqu64_avx512vl(*(undefined1 (*) [32])(puVar16 + uVar27));
        auVar57._8_8_ = (ulong)((byte)(uVar40 >> 1) & 1) * auVar52._8_8_;
        auVar57._0_8_ = (ulong)(bVar6 & 1) * auVar52._0_8_;
        auVar57._16_8_ = (ulong)((byte)(uVar40 >> 2) & 1) * auVar52._16_8_;
        auVar57._24_8_ = (uVar40 >> 3) * auVar52._24_8_;
        auVar51 = vpternlogq_avx512vl(auVar57,auVar95._0_32_,auVar51,0x6c);
        uVar27 = uVar27 + 4;
        auVar17 = ZEXT3264(auVar51);
      } while (uVar26 != uVar27);
      auVar58 = vmovdqa64_avx512vl(auVar51);
      auVar43._0_8_ = (ulong)(bVar6 & 1) * auVar58._0_8_ | (ulong)!(bool)(bVar6 & 1) * auVar95._0_8_
      ;
      bVar39 = (bool)((byte)(uVar40 >> 1) & 1);
      auVar43._8_8_ = (ulong)bVar39 * auVar58._8_8_ | (ulong)!bVar39 * auVar95._8_8_;
      bVar39 = (bool)((byte)(uVar40 >> 2) & 1);
      auVar53._16_8_ = (ulong)bVar39 * auVar58._16_8_ | (ulong)!bVar39 * auVar95._16_8_;
      auVar53._0_16_ = auVar43;
      auVar53._24_8_ =
           (uVar40 >> 3) * auVar58._24_8_ | (ulong)!SUB81(uVar40 >> 3,0) * auVar95._24_8_;
      vpshufd_avx(auVar43 ^ auVar53._16_16_,0xee);
    }
    auVar53 = vpbroadcastq_avx512vl();
    auVar51 = vpbroadcastq_avx512vl();
    uVar27 = 0;
    auVar58 = vpmovsxbq_avx2(ZEXT416(0x3020100));
    auVar96._8_8_ = 1;
    auVar96._0_8_ = 1;
    auVar96._16_8_ = 1;
    auVar96._24_8_ = 1;
    auVar100._8_8_ = 4;
    auVar100._0_8_ = 4;
    auVar100._16_8_ = 4;
    auVar100._24_8_ = 4;
    do {
      uVar40 = vpcmpuq_avx512vl(auVar58,auVar53,2);
      uVar40 = uVar40 & 0xf;
      auVar52 = vpsllvq_avx2(auVar96,auVar58);
      auVar56 = vmovdqu64_avx512vl(*(undefined1 (*) [32])((long)puVar33 + uVar27));
      auVar59._8_8_ = (ulong)((byte)(uVar40 >> 1) & 1) * auVar56._8_8_;
      auVar59._0_8_ = (ulong)((byte)uVar40 & 1) * auVar56._0_8_;
      auVar59._16_8_ = (ulong)((byte)(uVar40 >> 2) & 1) * auVar56._16_8_;
      auVar59._24_8_ = (uVar40 >> 3) * auVar56._24_8_;
      auVar52 = vpternlogq_avx512vl(auVar59,auVar52,auVar51,0xf8);
      auVar52 = vmovdqu64_avx512vl(auVar52);
      *(undefined1 (*) [32])((long)puVar33 + uVar27) = auVar52;
      auVar58 = vpaddq_avx2(auVar58,auVar100);
      uVar27 = uVar27 + 0x20;
    } while ((lVar31 * 8 & 0xffffffffffffffe0U) != uVar27);
    lVar20 = lVar20 + 1;
    lVar31 = lVar31 + -1;
  } while (lVar20 != 0x40);
  uVar26 = 0xffffffffffffffff;
LAB_00104d1a:
  lVar20 = 0;
  do {
    lVar31 = *(long *)((long)local_2d80._M_elems + lVar20);
    if (lVar31 != 0) break;
    bVar39 = lVar20 != 0x1f8;
    lVar20 = lVar20 + 8;
  } while (bVar39);
  if (lVar31 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Lanczos iteration ",0x12);
    poVar22 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar22 + -0x18) + (char)poVar22);
    std::ostream::put((char)poVar22);
    std::ostream::flush();
    uVar19 = 0x3f;
    uVar27 = 0;
    uVar28 = 0;
    do {
      bVar39 = (1L << (uVar27 & 0x3f) & uVar26) == 0;
      uVar7 = uVar28;
      if (!bVar39) {
        uVar7 = uVar19;
      }
      uVar19 = uVar19 - !bVar39;
      uVar28 = uVar28 + bVar39;
      *(int *)((long)&local_2e88 + (ulong)uVar7 * 4) = (int)uVar27;
      uVar27 = uVar27 + 1;
    } while (uVar27 != 0x40);
    memcpy(&local_3088,&local_2d80,0x200);
    lVar20 = 0;
    auVar50 = vpmovsxbq_avx2(ZEXT416(0x3020100));
    auVar84._8_8_ = 1;
    auVar84._0_8_ = 1;
    auVar84._16_8_ = 1;
    auVar84._24_8_ = 1;
    auVar91._8_8_ = 4;
    auVar91._0_8_ = 4;
    auVar91._16_8_ = 4;
    auVar91._24_8_ = 4;
    do {
      auVar58 = vpsllvq_avx2(auVar84,auVar50);
      *(undefined1 (*) [32])(local_2b80._M_elems + lVar20) = auVar58;
      lVar20 = lVar20 + 4;
      auVar50 = vpaddq_avx2(auVar50,auVar91);
    } while (lVar20 != 0x40);
    puVar23 = &local_2e88;
    uVar27 = 0;
    uVar40 = 0;
LAB_00104e48:
    uVar41 = (ulong)*(uint *)((long)&local_2e88 + uVar27 * 4);
    uVar32 = 1L << (uVar41 & 0x3f);
    lVar20 = 0;
LAB_00104e56:
    if ((local_3088._M_elems[*(uint *)((long)puVar23 + lVar20 * 4)] & uVar32) == 0)
    goto code_r0x00104e68;
    if (lVar20 != 0) {
      uVar19 = *(uint *)((long)puVar23 + lVar20 * 4);
      uVar4 = local_3088._M_elems[uVar41];
      local_3088._M_elems[uVar41] = local_3088._M_elems[uVar19];
      local_3088._M_elems[uVar19] = uVar4;
      uVar4 = local_2b80._M_elems[uVar41];
      local_2b80._M_elems[uVar41] = local_2b80._M_elems[uVar19];
      local_2b80._M_elems[uVar19] = uVar4;
    }
    uVar34 = 0;
    do {
      if ((uVar41 != uVar34) && ((local_3088._M_elems[uVar34] & uVar32) != 0)) {
        local_3088._M_elems[uVar34] = local_3088._M_elems[uVar34] ^ local_3088._M_elems[uVar41];
        local_2b80._M_elems[uVar34] = local_2b80._M_elems[uVar34] ^ local_2b80._M_elems[uVar41];
      }
      uVar34 = uVar34 + 1;
    } while (uVar34 != 0x40);
    uVar40 = uVar40 | uVar32;
    goto LAB_00104fc5;
  }
  __blanczos_matrix::sparse::multiply_regular(&local_3108,&local_3278,&local_3228,nthreads);
  __blanczos_matrix::sparse::multiply_regular(&local_3108,&local_3158,&local_32b8,nthreads);
  puVar25 = local_3278.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish;
  local_31f8._0_8_ =
       local_3278.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start;
  uVar27 = (long)local_3278.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)local_3278.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 3;
  local_31a0 = local_3228.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
  local_3198 = local_3228.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
  uVar40 = (long)local_3228.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)local_3228.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 3;
  uVar26 = uVar40;
  if (uVar40 < uVar27) {
    uVar26 = uVar27;
  }
  local_3170.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_3260,uVar26 << 7,(value_type_conflict3 *)&local_3170,
             (allocator_type *)&local_3178);
  __s = operator_new(0x4000);
  memset(__s,0,0x4000);
  uVar26 = 0;
  goto LAB_00105f34;
code_r0x00104e68:
  lVar31 = uVar27 + lVar20;
  lVar20 = lVar20 + 1;
  uVar34 = uVar27;
  if (lVar31 == 0x3f) goto LAB_00104e7b;
  goto LAB_00104e56;
  while (uVar34 = uVar34 + 1, uVar34 != 0x40) {
LAB_00104e7b:
    if ((local_2b80._M_elems[*(uint *)((long)&local_2e88 + uVar34 * 4)] & uVar32) != 0)
    goto LAB_00104e9b;
  }
  uVar34 = 0x40;
LAB_00104e9b:
  if ((uVar34 & 0xffffffff) != uVar27) {
    uVar19 = *(uint *)((long)&local_2e88 + (uVar34 & 0xffffffff) * 4);
    uVar4 = local_3088._M_elems[uVar41];
    local_3088._M_elems[uVar41] = local_3088._M_elems[uVar19];
    local_3088._M_elems[uVar19] = uVar4;
    uVar4 = local_2b80._M_elems[uVar41];
    local_2b80._M_elems[uVar41] = local_2b80._M_elems[uVar19];
    local_2b80._M_elems[uVar19] = uVar4;
  }
  uVar34 = 0;
  do {
    if ((uVar41 != uVar34) && (uVar5 = local_2b80._M_elems[uVar34], (uVar5 & uVar32) != 0)) {
      local_3088._M_elems[uVar34] = local_3088._M_elems[uVar34] ^ local_3088._M_elems[uVar41];
      local_2b80._M_elems[uVar34] = uVar5 ^ local_2b80._M_elems[uVar41];
    }
    uVar34 = uVar34 + 1;
  } while (uVar34 != 0x40);
  local_3088._M_elems[uVar41] = 0;
  local_2b80._M_elems[uVar41] = 0;
LAB_00104fc5:
  uVar27 = uVar27 + 1;
  puVar23 = (undefined8 *)((long)puVar23 + 4);
  if (uVar27 == 0x40) goto code_r0x00104fd6;
  goto LAB_00104e48;
code_r0x00104fd6:
  local_31f8 = vpbroadcastq_avx512vl();
  lVar20 = 0;
  auVar50 = vpmovsxbq_avx2(ZEXT416(0x3020100));
  auVar85._8_8_ = 1;
  auVar85._0_8_ = 1;
  auVar85._16_8_ = 1;
  auVar85._24_8_ = 1;
  auVar92._8_8_ = 4;
  auVar92._0_8_ = 4;
  auVar92._16_8_ = 4;
  auVar92._24_8_ = 4;
  do {
    auVar58 = vpsrlvq_avx2(local_31f8,auVar50);
    vptestnmq_avx512vl(auVar58,auVar85);
    auVar58 = vmovdqu64_avx512vl(SUB6432(ZEXT1664((undefined1  [16])0x0),0));
    *(undefined1 (*) [32])(local_2b80._M_elems + lVar20) = auVar58;
    lVar20 = lVar20 + 4;
    auVar50 = vpaddq_avx2(auVar50,auVar92);
  } while (lVar20 != 0x40);
  lVar20 = 0;
  do {
    auVar50 = vpand_avx2(local_31f8,*(undefined1 (*) [32])(local_2b80._M_elems + lVar20));
    *(undefined1 (*) [32])(local_2b80._M_elems + lVar20) = auVar50;
    lVar20 = lVar20 + 4;
  } while (lVar20 != 0x40);
  if ((uVar26 | uVar40) != 0xffffffffffffffff) {
    if (local_3248.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_3248.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      p_Var24 = (_anonymous_namespace_ *)
                local_3248.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                .super__Vector_impl_data._M_start;
      do {
        if ((*(ulong *)p_Var24 & ~(uVar26 | uVar40)) != 0) {
          uVar30 = 0xffffffff;
          goto LAB_00105cac;
        }
        p_Var24 = p_Var24 + 8;
      } while (p_Var24 !=
               (_anonymous_namespace_ *)
               local_3248.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "Not all indices in S[i] U S[i-1], but V[i-1] zero for those indices.",0x44);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
    std::ostream::put(-0x38);
    std::ostream::flush();
  }
  puVar16 = local_3190.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start;
  puVar15 = local_32b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish;
  puVar25 = local_32b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start;
  memset(&local_3088,0,0x200);
  lVar20 = (long)puVar15 - (long)puVar25 >> 3;
  uVar26 = lVar20 + (ulong)(lVar20 == 0) + 3 & 0xfffffffffffffffc;
  auVar50 = vpbroadcastq_avx512vl();
  auVar43 = vpmovsxbq_avx(ZEXT216(0x4000));
  do {
    uVar83 = auVar43._0_8_;
    auVar86._8_8_ = uVar83;
    auVar86._0_8_ = uVar83;
    auVar86._16_8_ = uVar83;
    auVar86._24_8_ = uVar83;
    if (puVar15 != puVar25) {
      uVar27 = 0;
      auVar58 = vpmovsxbq_avx2(ZEXT416(0x3020100));
      auVar17 = ZEXT1664((undefined1  [16])0x0);
      do {
        auVar95 = auVar17;
        auVar53 = vpbroadcastq_avx512vl();
        auVar53 = vpor_avx2(auVar53,auVar58);
        uVar41 = vpcmpuq_avx512vl(auVar53,auVar50,2);
        uVar41 = uVar41 & 0xf;
        auVar53 = vmovdqu64_avx512vl(*(undefined1 (*) [32])((long)puVar25 + uVar27 * 8));
        bVar6 = (byte)uVar41;
        auVar60._8_8_ = (ulong)((byte)(uVar41 >> 1) & 1) * auVar53._8_8_;
        auVar60._0_8_ = (ulong)(bVar6 & 1) * auVar53._0_8_;
        auVar60._16_8_ = (ulong)((byte)(uVar41 >> 2) & 1) * auVar53._16_8_;
        auVar60._24_8_ = (uVar41 >> 3) * auVar53._24_8_;
        auVar53 = vpsllvq_avx2(auVar60,auVar86);
        auVar51 = vmovdqu64_avx512vl(*(undefined1 (*) [32])(puVar16 + uVar27));
        auVar61._8_8_ = (ulong)((byte)(uVar41 >> 1) & 1) * auVar51._8_8_;
        auVar61._0_8_ = (ulong)(bVar6 & 1) * auVar51._0_8_;
        auVar61._16_8_ = (ulong)((byte)(uVar41 >> 2) & 1) * auVar51._16_8_;
        auVar61._24_8_ = (uVar41 >> 3) * auVar51._24_8_;
        auVar53 = vpternlogq_avx512vl(auVar61,auVar95._0_32_,auVar53,0x6c);
        uVar27 = uVar27 + 4;
        auVar17 = ZEXT3264(auVar53);
      } while (uVar26 != uVar27);
      auVar58 = vmovdqa64_avx512vl(auVar53);
      auVar44._0_8_ = (ulong)(bVar6 & 1) * auVar58._0_8_ | (ulong)!(bool)(bVar6 & 1) * auVar95._0_8_
      ;
      bVar39 = (bool)((byte)(uVar41 >> 1) & 1);
      auVar44._8_8_ = (ulong)bVar39 * auVar58._8_8_ | (ulong)!bVar39 * auVar95._8_8_;
      bVar39 = (bool)((byte)(uVar41 >> 2) & 1);
      auVar62._16_8_ = (ulong)bVar39 * auVar58._16_8_ | (ulong)!bVar39 * auVar95._16_8_;
      auVar62._0_16_ = auVar44;
      auVar62._24_8_ =
           (uVar41 >> 3) * auVar58._24_8_ | (ulong)!SUB81(uVar41 >> 3,0) * auVar95._24_8_;
      vpshufd_avx(auVar44 ^ auVar62._16_16_,0xee);
    }
    lVar20 = vpextrq_avx(auVar43,1);
    auVar53 = vpbroadcastq_avx512vl();
    auVar51 = vpbroadcastq_avx512vl();
    uVar27 = 0;
    auVar58 = vpmovsxbq_avx2(ZEXT416(0x3020100));
    auVar105._8_8_ = 1;
    auVar105._0_8_ = 1;
    auVar105._16_8_ = 1;
    auVar105._24_8_ = 1;
    auVar109._8_8_ = 4;
    auVar109._0_8_ = 4;
    auVar109._16_8_ = 4;
    auVar109._24_8_ = 4;
    do {
      uVar41 = vpcmpuq_avx512vl(auVar58,auVar53,2);
      uVar41 = uVar41 & 0xf;
      auVar52 = vpaddq_avx2(auVar58,auVar86);
      auVar52 = vpsllvq_avx2(auVar105,auVar52);
      auVar56 = vmovdqu64_avx512vl(*(undefined1 (*) [32])(local_3088._M_elems + uVar27));
      auVar63._8_8_ = (ulong)((byte)(uVar41 >> 1) & 1) * auVar56._8_8_;
      auVar63._0_8_ = (ulong)((byte)uVar41 & 1) * auVar56._0_8_;
      auVar63._16_8_ = (ulong)((byte)(uVar41 >> 2) & 1) * auVar56._16_8_;
      auVar63._24_8_ = (uVar41 >> 3) * auVar56._24_8_;
      auVar52 = vpternlogq_avx512vl(auVar63,auVar52,auVar51,0xf8);
      auVar52 = vmovdqu64_avx512vl(auVar52);
      *(undefined1 (*) [32])(local_3088._M_elems + uVar27) = auVar52;
      uVar27 = uVar27 + 4;
      auVar58 = vpaddq_avx2(auVar109,auVar58);
    } while ((lVar20 + 3U & 0xfffffffffffffffc) != uVar27);
    auVar43 = vpaddq_avx(auVar43,_DAT_00109080);
  } while (auVar43._0_8_ != 0x40);
  lVar20 = 1;
  lVar31 = 0x42;
  puVar33 = local_3088._M_elems;
  do {
    puVar33 = puVar33 + 1;
    if (puVar15 != puVar25) {
      auVar53 = vpbroadcastq_avx512vl();
      uVar27 = 0;
      auVar58 = vpmovsxbq_avx2(ZEXT416(0x3020100));
      auVar17 = ZEXT1664((undefined1  [16])0x0);
      do {
        auVar95 = auVar17;
        auVar51 = vpbroadcastq_avx512vl();
        auVar51 = vpor_avx2(auVar51,auVar58);
        uVar41 = vpcmpuq_avx512vl(auVar51,auVar50,2);
        uVar41 = uVar41 & 0xf;
        auVar51 = vmovdqu64_avx512vl(*(undefined1 (*) [32])((long)puVar25 + uVar27 * 8));
        bVar6 = (byte)uVar41;
        auVar64._8_8_ = (ulong)((byte)(uVar41 >> 1) & 1) * auVar51._8_8_;
        auVar64._0_8_ = (ulong)(bVar6 & 1) * auVar51._0_8_;
        auVar64._16_8_ = (ulong)((byte)(uVar41 >> 2) & 1) * auVar51._16_8_;
        auVar64._24_8_ = (uVar41 >> 3) * auVar51._24_8_;
        auVar51 = vpsrlvq_avx2(auVar64,auVar53);
        auVar52 = vmovdqu64_avx512vl(*(undefined1 (*) [32])(puVar16 + uVar27));
        auVar65._8_8_ = (ulong)((byte)(uVar41 >> 1) & 1) * auVar52._8_8_;
        auVar65._0_8_ = (ulong)(bVar6 & 1) * auVar52._0_8_;
        auVar65._16_8_ = (ulong)((byte)(uVar41 >> 2) & 1) * auVar52._16_8_;
        auVar65._24_8_ = (uVar41 >> 3) * auVar52._24_8_;
        auVar51 = vpternlogq_avx512vl(auVar65,auVar95._0_32_,auVar51,0x6c);
        uVar27 = uVar27 + 4;
        auVar17 = ZEXT3264(auVar51);
      } while (uVar26 != uVar27);
      auVar58 = vmovdqa64_avx512vl(auVar51);
      auVar45._0_8_ = (ulong)(bVar6 & 1) * auVar58._0_8_ | (ulong)!(bool)(bVar6 & 1) * auVar95._0_8_
      ;
      bVar39 = (bool)((byte)(uVar41 >> 1) & 1);
      auVar45._8_8_ = (ulong)bVar39 * auVar58._8_8_ | (ulong)!bVar39 * auVar95._8_8_;
      bVar39 = (bool)((byte)(uVar41 >> 2) & 1);
      auVar66._16_8_ = (ulong)bVar39 * auVar58._16_8_ | (ulong)!bVar39 * auVar95._16_8_;
      auVar66._0_16_ = auVar45;
      auVar66._24_8_ =
           (uVar41 >> 3) * auVar58._24_8_ | (ulong)!SUB81(uVar41 >> 3,0) * auVar95._24_8_;
      vpshufd_avx(auVar45 ^ auVar66._16_16_,0xee);
    }
    auVar53 = vpbroadcastq_avx512vl();
    auVar51 = vpbroadcastq_avx512vl();
    uVar27 = 0;
    auVar58 = vpmovsxbq_avx2(ZEXT416(0x3020100));
    auVar97._8_8_ = 1;
    auVar97._0_8_ = 1;
    auVar97._16_8_ = 1;
    auVar97._24_8_ = 1;
    auVar101._8_8_ = 4;
    auVar101._0_8_ = 4;
    auVar101._16_8_ = 4;
    auVar101._24_8_ = 4;
    do {
      uVar41 = vpcmpuq_avx512vl(auVar58,auVar53,2);
      uVar41 = uVar41 & 0xf;
      auVar52 = vpsllvq_avx2(auVar97,auVar58);
      auVar56 = vmovdqu64_avx512vl(*(undefined1 (*) [32])((long)puVar33 + uVar27));
      auVar67._8_8_ = (ulong)((byte)(uVar41 >> 1) & 1) * auVar56._8_8_;
      auVar67._0_8_ = (ulong)((byte)uVar41 & 1) * auVar56._0_8_;
      auVar67._16_8_ = (ulong)((byte)(uVar41 >> 2) & 1) * auVar56._16_8_;
      auVar67._24_8_ = (uVar41 >> 3) * auVar56._24_8_;
      auVar52 = vpternlogq_avx512vl(auVar67,auVar52,auVar51,0xf8);
      auVar52 = vmovdqu64_avx512vl(auVar52);
      *(undefined1 (*) [32])((long)puVar33 + uVar27) = auVar52;
      auVar58 = vpaddq_avx2(auVar58,auVar101);
      uVar27 = uVar27 + 0x20;
    } while ((lVar31 * 8 & 0xffffffffffffffe0U) != uVar27);
    lVar20 = lVar20 + 1;
    lVar31 = lVar31 + -1;
  } while (lVar20 != 0x40);
  (anonymous_namespace)::mul<std::array<unsigned_long,64ul>>(&local_2b80,&local_3088,&local_2380);
  (anonymous_namespace)::mul<std::vector<unsigned_long,std::allocator<unsigned_long>>>
            ((_anonymous_namespace_ *)puVar25,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)puVar15,&local_2380,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             local_3298.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start);
  if ((long)local_3228.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_3228.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != 0) {
    lVar20 = (long)local_3228.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_3228.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3;
    lVar31 = 0;
    do {
      local_3228.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[lVar31] =
           local_3228.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start[lVar31] ^
           *(ulong *)((long)local_3298.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start + lVar31 * 8);
      lVar31 = lVar31 + 1;
    } while (lVar20 + (ulong)(lVar20 == 0) != lVar31);
  }
  (anonymous_namespace)::mul<std::array<unsigned_long,64ul>>(&local_2780,&local_2980,&local_3088);
  lVar20 = 0;
  auVar50 = vpmovsxbq_avx2(ZEXT416(0x3020100));
  auVar87._8_8_ = 1;
  auVar87._0_8_ = 1;
  auVar87._16_8_ = 1;
  auVar87._24_8_ = 1;
  auVar93._8_8_ = 4;
  auVar93._0_8_ = 4;
  auVar93._16_8_ = 4;
  auVar93._24_8_ = 4;
  do {
    auVar58 = vpsllvq_avx2(auVar87,auVar50);
    *(undefined1 (*) [32])(local_3088._M_elems + lVar20) =
         auVar58 ^ *(undefined1 (*) [32])(local_3088._M_elems + lVar20);
    lVar20 = lVar20 + 4;
    auVar50 = vpaddq_avx2(auVar50,auVar93);
  } while (lVar20 != 0x40);
  (anonymous_namespace)::mul<std::array<unsigned_long,64ul>>(&local_1f80,&local_3088,&local_2380);
  (anonymous_namespace)::mul<std::array<unsigned_long,64ul>>(&local_2380,&local_2180,&local_2580);
  lVar20 = 0;
  do {
    auVar50 = vpand_avx2(local_31f8,*(undefined1 (*) [32])(local_2580._M_elems + lVar20));
    *(undefined1 (*) [32])(local_2580._M_elems + lVar20) = auVar50;
    lVar20 = lVar20 + 4;
  } while (lVar20 != 0x40);
  (anonymous_namespace)::mul<std::array<unsigned_long,64ul>>(&local_2980,&local_2d80,&local_2380);
  puVar15 = local_3210.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish;
  puVar25 = local_3210.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start;
  lVar20 = 0;
  do {
    auVar50 = vpand_avx2(local_31f8,*(undefined1 (*) [32])(local_2380._M_elems + lVar20));
    *(undefined1 (*) [32])(local_2380._M_elems + lVar20) = auVar50;
    lVar20 = lVar20 + 4;
  } while (lVar20 != 0x40);
  memset(&local_3088,0,0x200);
  lVar20 = (long)puVar15 - (long)puVar25 >> 3;
  uVar26 = lVar20 + (ulong)(lVar20 == 0) + 3 & 0xfffffffffffffffc;
  auVar50 = vpbroadcastq_avx512vl();
  auVar43 = vpmovsxbq_avx(ZEXT216(0x4000));
  do {
    uVar83 = auVar43._0_8_;
    auVar88._8_8_ = uVar83;
    auVar88._0_8_ = uVar83;
    auVar88._16_8_ = uVar83;
    auVar88._24_8_ = uVar83;
    if (puVar15 != puVar25) {
      uVar27 = 0;
      auVar58 = vpmovsxbq_avx2(ZEXT416(0x3020100));
      auVar17 = ZEXT1664((undefined1  [16])0x0);
      do {
        auVar95 = auVar17;
        auVar53 = vpbroadcastq_avx512vl();
        auVar53 = vpor_avx2(auVar53,auVar58);
        uVar41 = vpcmpuq_avx512vl(auVar53,auVar50,2);
        uVar41 = uVar41 & 0xf;
        auVar53 = vmovdqu64_avx512vl(*(undefined1 (*) [32])(puVar25 + uVar27));
        auVar68._8_8_ = (ulong)((byte)(uVar41 >> 1) & 1) * auVar53._8_8_;
        auVar68._0_8_ = (ulong)((byte)uVar41 & 1) * auVar53._0_8_;
        auVar68._16_8_ = (ulong)((byte)(uVar41 >> 2) & 1) * auVar53._16_8_;
        auVar68._24_8_ = (uVar41 >> 3) * auVar53._24_8_;
        auVar53 = vpsllvq_avx2(auVar68,auVar88);
        auVar53 = vpternlogq_avx512vl(auVar53,auVar95._0_32_,auVar68,0x6c);
        uVar27 = uVar27 + 4;
        auVar17 = ZEXT3264(auVar53);
      } while (uVar26 != uVar27);
      auVar58 = vmovdqa64_avx512vl(auVar53);
      bVar39 = (bool)((byte)uVar41 & 1);
      auVar46._0_8_ = (ulong)bVar39 * auVar58._0_8_ | (ulong)!bVar39 * auVar95._0_8_;
      bVar39 = (bool)((byte)(uVar41 >> 1) & 1);
      auVar46._8_8_ = (ulong)bVar39 * auVar58._8_8_ | (ulong)!bVar39 * auVar95._8_8_;
      bVar39 = (bool)((byte)(uVar41 >> 2) & 1);
      auVar69._16_8_ = (ulong)bVar39 * auVar58._16_8_ | (ulong)!bVar39 * auVar95._16_8_;
      auVar69._0_16_ = auVar46;
      auVar69._24_8_ =
           (uVar41 >> 3) * auVar58._24_8_ | (ulong)!SUB81(uVar41 >> 3,0) * auVar95._24_8_;
      vpshufd_avx(auVar46 ^ auVar69._16_16_,0xee);
    }
    lVar20 = vpextrq_avx(auVar43,1);
    auVar53 = vpbroadcastq_avx512vl();
    auVar51 = vpbroadcastq_avx512vl();
    uVar27 = 0;
    auVar58 = vpmovsxbq_avx2(ZEXT416(0x3020100));
    auVar106._8_8_ = 1;
    auVar106._0_8_ = 1;
    auVar106._16_8_ = 1;
    auVar106._24_8_ = 1;
    auVar110._8_8_ = 4;
    auVar110._0_8_ = 4;
    auVar110._16_8_ = 4;
    auVar110._24_8_ = 4;
    do {
      uVar41 = vpcmpuq_avx512vl(auVar58,auVar53,2);
      uVar41 = uVar41 & 0xf;
      auVar52 = vpaddq_avx2(auVar58,auVar88);
      auVar52 = vpsllvq_avx2(auVar106,auVar52);
      auVar56 = vmovdqu64_avx512vl(*(undefined1 (*) [32])(local_3088._M_elems + uVar27));
      auVar70._8_8_ = (ulong)((byte)(uVar41 >> 1) & 1) * auVar56._8_8_;
      auVar70._0_8_ = (ulong)((byte)uVar41 & 1) * auVar56._0_8_;
      auVar70._16_8_ = (ulong)((byte)(uVar41 >> 2) & 1) * auVar56._16_8_;
      auVar70._24_8_ = (uVar41 >> 3) * auVar56._24_8_;
      auVar52 = vpternlogq_avx512vl(auVar70,auVar52,auVar51,0xf8);
      auVar52 = vmovdqu64_avx512vl(auVar52);
      *(undefined1 (*) [32])(local_3088._M_elems + uVar27) = auVar52;
      uVar27 = uVar27 + 4;
      auVar58 = vpaddq_avx2(auVar110,auVar58);
    } while ((lVar20 + 3U & 0xfffffffffffffffc) != uVar27);
    auVar43 = vpaddq_avx(auVar43,_DAT_00109080);
  } while (auVar43._0_8_ != 0x40);
  lVar20 = 1;
  lVar31 = 0x42;
  puVar33 = local_3088._M_elems;
  do {
    puVar33 = puVar33 + 1;
    if (puVar15 != puVar25) {
      auVar53 = vpbroadcastq_avx512vl();
      uVar27 = 0;
      auVar58 = vpmovsxbq_avx2(ZEXT416(0x3020100));
      auVar17 = ZEXT1664((undefined1  [16])0x0);
      do {
        auVar95 = auVar17;
        auVar51 = vpbroadcastq_avx512vl();
        auVar51 = vpor_avx2(auVar51,auVar58);
        uVar41 = vpcmpuq_avx512vl(auVar51,auVar50,2);
        uVar41 = uVar41 & 0xf;
        auVar51 = vmovdqu64_avx512vl(*(undefined1 (*) [32])(puVar25 + uVar27));
        auVar71._8_8_ = (ulong)((byte)(uVar41 >> 1) & 1) * auVar51._8_8_;
        auVar71._0_8_ = (ulong)((byte)uVar41 & 1) * auVar51._0_8_;
        auVar71._16_8_ = (ulong)((byte)(uVar41 >> 2) & 1) * auVar51._16_8_;
        auVar71._24_8_ = (uVar41 >> 3) * auVar51._24_8_;
        auVar51 = vpsrlvq_avx2(auVar71,auVar53);
        auVar51 = vpternlogq_avx512vl(auVar51,auVar95._0_32_,auVar71,0x6c);
        uVar27 = uVar27 + 4;
        auVar17 = ZEXT3264(auVar51);
      } while (uVar26 != uVar27);
      auVar58 = vmovdqa64_avx512vl(auVar51);
      bVar39 = (bool)((byte)uVar41 & 1);
      auVar47._0_8_ = (ulong)bVar39 * auVar58._0_8_ | (ulong)!bVar39 * auVar95._0_8_;
      bVar39 = (bool)((byte)(uVar41 >> 1) & 1);
      auVar47._8_8_ = (ulong)bVar39 * auVar58._8_8_ | (ulong)!bVar39 * auVar95._8_8_;
      bVar39 = (bool)((byte)(uVar41 >> 2) & 1);
      auVar72._16_8_ = (ulong)bVar39 * auVar58._16_8_ | (ulong)!bVar39 * auVar95._16_8_;
      auVar72._0_16_ = auVar47;
      auVar72._24_8_ =
           (uVar41 >> 3) * auVar58._24_8_ | (ulong)!SUB81(uVar41 >> 3,0) * auVar95._24_8_;
      vpshufd_avx(auVar47 ^ auVar72._16_16_,0xee);
    }
    auVar53 = vpbroadcastq_avx512vl();
    auVar51 = vpbroadcastq_avx512vl();
    uVar27 = 0;
    auVar58 = vpmovsxbq_avx2(ZEXT416(0x3020100));
    auVar98._8_8_ = 1;
    auVar98._0_8_ = 1;
    auVar98._16_8_ = 1;
    auVar98._24_8_ = 1;
    auVar102._8_8_ = 4;
    auVar102._0_8_ = 4;
    auVar102._16_8_ = 4;
    auVar102._24_8_ = 4;
    do {
      uVar41 = vpcmpuq_avx512vl(auVar58,auVar53,2);
      uVar41 = uVar41 & 0xf;
      auVar52 = vpsllvq_avx2(auVar98,auVar58);
      auVar56 = vmovdqu64_avx512vl(*(undefined1 (*) [32])((long)puVar33 + uVar27));
      auVar73._8_8_ = (ulong)((byte)(uVar41 >> 1) & 1) * auVar56._8_8_;
      auVar73._0_8_ = (ulong)((byte)uVar41 & 1) * auVar56._0_8_;
      auVar73._16_8_ = (ulong)((byte)(uVar41 >> 2) & 1) * auVar56._16_8_;
      auVar73._24_8_ = (uVar41 >> 3) * auVar56._24_8_;
      auVar52 = vpternlogq_avx512vl(auVar73,auVar52,auVar51,0xf8);
      auVar52 = vmovdqu64_avx512vl(auVar52);
      *(undefined1 (*) [32])((long)puVar33 + uVar27) = auVar52;
      auVar58 = vpaddq_avx2(auVar58,auVar102);
      uVar27 = uVar27 + 0x20;
    } while ((lVar31 * 8 & 0xffffffffffffffe0U) != uVar27);
    lVar20 = lVar20 + 1;
    lVar31 = lVar31 + -1;
  } while (lVar20 != 0x40);
  lVar20 = 0;
  do {
    auVar50 = vpand_avx2(local_31f8,*(undefined1 (*) [32])(local_3088._M_elems + lVar20));
    *(undefined1 (*) [32])(local_3088._M_elems + lVar20) = auVar50;
    lVar20 = lVar20 + 4;
  } while (lVar20 != 0x40);
  lVar20 = 0;
  do {
    uVar26 = local_2d80._M_elems[lVar20 + 1];
    uVar27 = local_2d80._M_elems[lVar20 + 2];
    uVar41 = local_2d80._M_elems[lVar20 + 3];
    uVar32 = local_3088._M_elems[lVar20 + 1];
    uVar34 = local_3088._M_elems[lVar20 + 2];
    uVar5 = local_3088._M_elems[lVar20 + 3];
    local_2180._M_elems[lVar20] = local_2d80._M_elems[lVar20] ^ local_3088._M_elems[lVar20];
    local_2180._M_elems[lVar20 + 1] = uVar26 ^ uVar32;
    local_2180._M_elems[lVar20 + 2] = uVar27 ^ uVar34;
    local_2180._M_elems[lVar20 + 3] = uVar41 ^ uVar5;
    lVar20 = lVar20 + 4;
  } while (lVar20 != 0x40);
  (anonymous_namespace)::mul<std::array<unsigned_long,64ul>>(&local_2b80,&local_2180,&local_3088);
  lVar20 = 0;
  auVar50 = vpmovsxbq_avx2(ZEXT416(0x3020100));
  auVar89._8_8_ = 1;
  auVar89._0_8_ = 1;
  auVar89._16_8_ = 1;
  auVar89._24_8_ = 1;
  auVar94._8_8_ = 4;
  auVar94._0_8_ = 4;
  auVar94._16_8_ = 4;
  auVar94._24_8_ = 4;
  do {
    auVar58 = vpsllvq_avx2(auVar89,auVar50);
    *(undefined1 (*) [32])(local_3088._M_elems + lVar20) =
         auVar58 ^ *(undefined1 (*) [32])(local_3088._M_elems + lVar20);
    lVar20 = lVar20 + 4;
    auVar50 = vpaddq_avx2(auVar50,auVar94);
  } while (lVar20 != 0x40);
  auVar50 = vpmovsxbq_avx2(ZEXT416(0x3020100));
  if ((long)puVar15 - (long)puVar25 != 0) {
    auVar58 = vpbroadcastq_avx512vl();
    auVar58 = vpsrlq_avx2(auVar58,3);
    uVar26 = 0;
    do {
      auVar53 = vpbroadcastq_avx512vl();
      auVar53 = vpor_avx2(auVar53,auVar50);
      uVar27 = vpcmpuq_avx512vl(auVar53,auVar58,2);
      uVar27 = uVar27 & 0xf;
      auVar53 = vmovdqu64_avx512vl(*(undefined1 (*) [32])(puVar25 + uVar26));
      auVar74._8_8_ = (ulong)((byte)(uVar27 >> 1) & 1) * auVar53._8_8_;
      auVar74._0_8_ = (ulong)((byte)uVar27 & 1) * auVar53._0_8_;
      auVar74._16_8_ = (ulong)((byte)(uVar27 >> 2) & 1) * auVar53._16_8_;
      auVar74._24_8_ = (uVar27 >> 3) * auVar53._24_8_;
      auVar53 = vpand_avx2(auVar74,local_31f8);
      auVar53 = vmovdqu64_avx512vl(auVar53);
      *(undefined1 (*) [32])(puVar25 + uVar26) = auVar53;
      uVar26 = uVar26 + 4;
    } while (((((long)puVar15 - (long)puVar25) - 8U >> 3) + 4 & 0xfffffffffffffffc) != uVar26);
  }
  (anonymous_namespace)::mul<std::vector<unsigned_long,std::allocator<unsigned_long>>>
            ((_anonymous_namespace_ *)
             local_32b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             local_32b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish,&local_3088,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             local_31c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start);
  if ((long)local_3210.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_3210.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != 0) {
    lVar20 = (long)local_3210.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_3210.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3;
    lVar31 = 0;
    do {
      *(ulong *)((long)local_3298.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar31 * 8) =
           (ulong)(&(((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
                     local_31c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start)->_M_impl).super__Vector_impl_data.
                    _M_start)[lVar31] ^
           local_3210.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start[lVar31];
      lVar31 = lVar31 + 1;
    } while (lVar20 + (ulong)(lVar20 == 0) != lVar31);
  }
  (anonymous_namespace)::mul<std::vector<unsigned_long,std::allocator<unsigned_long>>>
            ((_anonymous_namespace_ *)
             local_3248.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             local_3248.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish,&local_2380,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             local_31c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start);
  if ((long)local_3298.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_3298.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != 0) {
    lVar20 = (long)local_3298.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_3298.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3;
    lVar31 = 0;
    do {
      *(ulong *)((long)local_3298.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar31 * 8) =
           *(ulong *)((long)local_3298.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start + lVar31 * 8) ^
           (ulong)(&(((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
                     local_31c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start)->_M_impl).super__Vector_impl_data.
                    _M_start)[lVar31];
      lVar31 = lVar31 + 1;
    } while (lVar20 + (ulong)(lVar20 == 0) != lVar31);
  }
  (anonymous_namespace)::mul<std::vector<unsigned_long,std::allocator<unsigned_long>>>
            ((_anonymous_namespace_ *)
             local_31d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             local_31d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish,&local_2580,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             local_31c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start);
  puVar16 = local_31d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  puVar15 = local_31d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish;
  puVar25 = local_31d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_31d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_3248.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_31d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_3248.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start;
  if ((long)local_3298.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_3298.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != 0) {
    lVar20 = (long)local_3298.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_3298.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3;
    lVar31 = 0;
    do {
      *(ulong *)((long)local_3298.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar31 * 8) =
           *(ulong *)((long)local_3298.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start + lVar31 * 8) ^
           (ulong)(&(((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
                     local_31c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start)->_M_impl).super__Vector_impl_data.
                    _M_start)[lVar31];
      lVar31 = lVar31 + 1;
    } while (lVar20 + (ulong)(lVar20 == 0) != lVar31);
  }
  local_31d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_3248.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_3248.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_32b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_3248.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_32b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_3248.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_32b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_32b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_3298.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_32b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_3298.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_32b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_3298.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_3298.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = puVar25;
  local_3298.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = puVar15;
  local_3298.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = puVar16;
  __blanczos_matrix::sparse::multiply_regular(&local_3108,&local_3278,&local_32b8,nthreads);
  __blanczos_matrix::sparse::multiply_transpose(&local_3108,&local_3210,&local_3278,nthreads);
  puVar16 = local_3210.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start;
  puVar15 = local_32b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish;
  puVar25 = local_32b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start;
  lVar20 = 0;
  do {
    uVar4 = local_1f80._M_elems[lVar20];
    uVar8 = local_1f80._M_elems[lVar20 + 1];
    uVar9 = local_1f80._M_elems[lVar20 + 2];
    uVar10 = local_1f80._M_elems[lVar20 + 3];
    uVar11 = local_2980._M_elems[lVar20 + 1];
    uVar12 = local_2980._M_elems[lVar20 + 2];
    uVar13 = local_2980._M_elems[lVar20 + 3];
    local_1f80._M_elems[lVar20] = local_2980._M_elems[lVar20];
    local_1f80._M_elems[lVar20 + 1] = uVar11;
    local_1f80._M_elems[lVar20 + 2] = uVar12;
    local_1f80._M_elems[lVar20 + 3] = uVar13;
    local_2980._M_elems[lVar20] = uVar4;
    local_2980._M_elems[lVar20 + 1] = uVar8;
    local_2980._M_elems[lVar20 + 2] = uVar9;
    local_2980._M_elems[lVar20 + 3] = uVar10;
    lVar20 = lVar20 + 4;
  } while (lVar20 != 0x40);
  lVar20 = 0;
  do {
    uVar4 = local_2980._M_elems[lVar20];
    uVar8 = local_2980._M_elems[lVar20 + 1];
    uVar9 = local_2980._M_elems[lVar20 + 2];
    uVar10 = local_2980._M_elems[lVar20 + 3];
    uVar11 = local_2b80._M_elems[lVar20 + 1];
    uVar12 = local_2b80._M_elems[lVar20 + 2];
    uVar13 = local_2b80._M_elems[lVar20 + 3];
    local_2980._M_elems[lVar20] = local_2b80._M_elems[lVar20];
    local_2980._M_elems[lVar20 + 1] = uVar11;
    local_2980._M_elems[lVar20 + 2] = uVar12;
    local_2980._M_elems[lVar20 + 3] = uVar13;
    local_2b80._M_elems[lVar20] = uVar4;
    local_2b80._M_elems[lVar20 + 1] = uVar8;
    local_2b80._M_elems[lVar20 + 2] = uVar9;
    local_2b80._M_elems[lVar20 + 3] = uVar10;
    lVar20 = lVar20 + 4;
  } while (lVar20 != 0x40);
  lVar20 = 0;
  do {
    uVar4 = local_2780._M_elems[lVar20];
    uVar8 = local_2780._M_elems[lVar20 + 1];
    uVar9 = local_2780._M_elems[lVar20 + 2];
    uVar10 = local_2780._M_elems[lVar20 + 3];
    uVar11 = local_2d80._M_elems[lVar20 + 1];
    uVar12 = local_2d80._M_elems[lVar20 + 2];
    uVar13 = local_2d80._M_elems[lVar20 + 3];
    local_2780._M_elems[lVar20] = local_2d80._M_elems[lVar20];
    local_2780._M_elems[lVar20 + 1] = uVar11;
    local_2780._M_elems[lVar20 + 2] = uVar12;
    local_2780._M_elems[lVar20 + 3] = uVar13;
    local_2d80._M_elems[lVar20] = uVar4;
    local_2d80._M_elems[lVar20 + 1] = uVar8;
    local_2d80._M_elems[lVar20 + 2] = uVar9;
    local_2d80._M_elems[lVar20 + 3] = uVar10;
    lVar20 = lVar20 + 4;
  } while (lVar20 != 0x40);
  memset(&local_2d80,0,0x200);
  lVar20 = (long)puVar15 - (long)puVar25 >> 3;
  uVar27 = lVar20 + (ulong)(lVar20 == 0) + 3 & 0xfffffffffffffffc;
  auVar50 = vpbroadcastq_avx512vl();
  auVar43 = vpmovsxbq_avx(ZEXT216(0x4000));
  do {
    uVar83 = auVar43._0_8_;
    auVar90._8_8_ = uVar83;
    auVar90._0_8_ = uVar83;
    auVar90._16_8_ = uVar83;
    auVar90._24_8_ = uVar83;
    if (puVar15 != puVar25) {
      uVar26 = 0;
      auVar58 = vpmovsxbq_avx2(ZEXT416(0x3020100));
      auVar17 = ZEXT1664((undefined1  [16])0x0);
      do {
        auVar95 = auVar17;
        auVar53 = vpbroadcastq_avx512vl();
        auVar53 = vpor_avx2(auVar53,auVar58);
        uVar41 = vpcmpuq_avx512vl(auVar53,auVar50,2);
        uVar41 = uVar41 & 0xf;
        auVar53 = vmovdqu64_avx512vl(*(undefined1 (*) [32])((long)puVar25 + uVar26 * 8));
        bVar6 = (byte)uVar41;
        auVar75._8_8_ = (ulong)((byte)(uVar41 >> 1) & 1) * auVar53._8_8_;
        auVar75._0_8_ = (ulong)(bVar6 & 1) * auVar53._0_8_;
        auVar75._16_8_ = (ulong)((byte)(uVar41 >> 2) & 1) * auVar53._16_8_;
        auVar75._24_8_ = (uVar41 >> 3) * auVar53._24_8_;
        auVar53 = vpsllvq_avx2(auVar75,auVar90);
        auVar51 = vmovdqu64_avx512vl(*(undefined1 (*) [32])(puVar16 + uVar26));
        auVar76._8_8_ = (ulong)((byte)(uVar41 >> 1) & 1) * auVar51._8_8_;
        auVar76._0_8_ = (ulong)(bVar6 & 1) * auVar51._0_8_;
        auVar76._16_8_ = (ulong)((byte)(uVar41 >> 2) & 1) * auVar51._16_8_;
        auVar76._24_8_ = (uVar41 >> 3) * auVar51._24_8_;
        auVar53 = vpternlogq_avx512vl(auVar76,auVar95._0_32_,auVar53,0x6c);
        uVar26 = uVar26 + 4;
        auVar17 = ZEXT3264(auVar53);
      } while (uVar27 != uVar26);
      auVar58 = vmovdqa64_avx512vl(auVar53);
      auVar48._0_8_ = (ulong)(bVar6 & 1) * auVar58._0_8_ | (ulong)!(bool)(bVar6 & 1) * auVar95._0_8_
      ;
      bVar39 = (bool)((byte)(uVar41 >> 1) & 1);
      auVar48._8_8_ = (ulong)bVar39 * auVar58._8_8_ | (ulong)!bVar39 * auVar95._8_8_;
      bVar39 = (bool)((byte)(uVar41 >> 2) & 1);
      auVar77._16_8_ = (ulong)bVar39 * auVar58._16_8_ | (ulong)!bVar39 * auVar95._16_8_;
      auVar77._0_16_ = auVar48;
      auVar77._24_8_ =
           (uVar41 >> 3) * auVar58._24_8_ | (ulong)!SUB81(uVar41 >> 3,0) * auVar95._24_8_;
      vpshufd_avx(auVar48 ^ auVar77._16_16_,0xee);
    }
    lVar20 = vpextrq_avx(auVar43,1);
    auVar53 = vpbroadcastq_avx512vl();
    auVar51 = vpbroadcastq_avx512vl();
    uVar26 = 0;
    auVar58 = vpmovsxbq_avx2(ZEXT416(0x3020100));
    auVar107._8_8_ = 1;
    auVar107._0_8_ = 1;
    auVar107._16_8_ = 1;
    auVar107._24_8_ = 1;
    auVar111._8_8_ = 4;
    auVar111._0_8_ = 4;
    auVar111._16_8_ = 4;
    auVar111._24_8_ = 4;
    do {
      uVar41 = vpcmpuq_avx512vl(auVar58,auVar53,2);
      uVar41 = uVar41 & 0xf;
      auVar52 = vpaddq_avx2(auVar58,auVar90);
      auVar52 = vpsllvq_avx2(auVar107,auVar52);
      auVar56 = vmovdqu64_avx512vl(*(undefined1 (*) [32])(local_2d80._M_elems + uVar26));
      auVar78._8_8_ = (ulong)((byte)(uVar41 >> 1) & 1) * auVar56._8_8_;
      auVar78._0_8_ = (ulong)((byte)uVar41 & 1) * auVar56._0_8_;
      auVar78._16_8_ = (ulong)((byte)(uVar41 >> 2) & 1) * auVar56._16_8_;
      auVar78._24_8_ = (uVar41 >> 3) * auVar56._24_8_;
      auVar52 = vpternlogq_avx512vl(auVar78,auVar52,auVar51,0xf8);
      auVar52 = vmovdqu64_avx512vl(auVar52);
      *(undefined1 (*) [32])(local_2d80._M_elems + uVar26) = auVar52;
      uVar26 = uVar26 + 4;
      auVar58 = vpaddq_avx2(auVar111,auVar58);
    } while ((lVar20 + 3U & 0xfffffffffffffffc) != uVar26);
    auVar43 = vpaddq_avx(auVar43,_DAT_00109080);
  } while (auVar43._0_8_ != 0x40);
  lVar20 = 1;
  lVar31 = 0x42;
  puVar33 = local_2d80._M_elems;
  do {
    puVar33 = puVar33 + 1;
    if (puVar15 != puVar25) {
      auVar53 = vpbroadcastq_avx512vl();
      uVar26 = 0;
      auVar58 = vpmovsxbq_avx2(ZEXT416(0x3020100));
      auVar17 = ZEXT1664((undefined1  [16])0x0);
      do {
        auVar95 = auVar17;
        auVar51 = vpbroadcastq_avx512vl();
        auVar51 = vpor_avx2(auVar51,auVar58);
        uVar41 = vpcmpuq_avx512vl(auVar51,auVar50,2);
        uVar41 = uVar41 & 0xf;
        auVar51 = vmovdqu64_avx512vl(*(undefined1 (*) [32])((long)puVar25 + uVar26 * 8));
        bVar6 = (byte)uVar41;
        auVar79._8_8_ = (ulong)((byte)(uVar41 >> 1) & 1) * auVar51._8_8_;
        auVar79._0_8_ = (ulong)(bVar6 & 1) * auVar51._0_8_;
        auVar79._16_8_ = (ulong)((byte)(uVar41 >> 2) & 1) * auVar51._16_8_;
        auVar79._24_8_ = (uVar41 >> 3) * auVar51._24_8_;
        auVar51 = vpsrlvq_avx2(auVar79,auVar53);
        auVar52 = vmovdqu64_avx512vl(*(undefined1 (*) [32])(puVar16 + uVar26));
        auVar80._8_8_ = (ulong)((byte)(uVar41 >> 1) & 1) * auVar52._8_8_;
        auVar80._0_8_ = (ulong)(bVar6 & 1) * auVar52._0_8_;
        auVar80._16_8_ = (ulong)((byte)(uVar41 >> 2) & 1) * auVar52._16_8_;
        auVar80._24_8_ = (uVar41 >> 3) * auVar52._24_8_;
        auVar51 = vpternlogq_avx512vl(auVar80,auVar95._0_32_,auVar51,0x6c);
        uVar26 = uVar26 + 4;
        auVar17 = ZEXT3264(auVar51);
      } while (uVar27 != uVar26);
      auVar58 = vmovdqa64_avx512vl(auVar51);
      auVar49._0_8_ = (ulong)(bVar6 & 1) * auVar58._0_8_ | (ulong)!(bool)(bVar6 & 1) * auVar95._0_8_
      ;
      bVar39 = (bool)((byte)(uVar41 >> 1) & 1);
      auVar49._8_8_ = (ulong)bVar39 * auVar58._8_8_ | (ulong)!bVar39 * auVar95._8_8_;
      bVar39 = (bool)((byte)(uVar41 >> 2) & 1);
      auVar81._16_8_ = (ulong)bVar39 * auVar58._16_8_ | (ulong)!bVar39 * auVar95._16_8_;
      auVar81._0_16_ = auVar49;
      auVar81._24_8_ =
           (uVar41 >> 3) * auVar58._24_8_ | (ulong)!SUB81(uVar41 >> 3,0) * auVar95._24_8_;
      vpshufd_avx(auVar49 ^ auVar81._16_16_,0xee);
    }
    auVar53 = vpbroadcastq_avx512vl();
    auVar51 = vpbroadcastq_avx512vl();
    uVar26 = 0;
    auVar58 = vpmovsxbq_avx2(ZEXT416(0x3020100));
    auVar99._8_8_ = 1;
    auVar99._0_8_ = 1;
    auVar99._16_8_ = 1;
    auVar99._24_8_ = 1;
    auVar103._8_8_ = 4;
    auVar103._0_8_ = 4;
    auVar103._16_8_ = 4;
    auVar103._24_8_ = 4;
    do {
      uVar41 = vpcmpuq_avx512vl(auVar58,auVar53,2);
      uVar41 = uVar41 & 0xf;
      auVar52 = vpsllvq_avx2(auVar99,auVar58);
      auVar56 = vmovdqu64_avx512vl(*(undefined1 (*) [32])((long)puVar33 + uVar26));
      auVar82._8_8_ = (ulong)((byte)(uVar41 >> 1) & 1) * auVar56._8_8_;
      auVar82._0_8_ = (ulong)((byte)uVar41 & 1) * auVar56._0_8_;
      auVar82._16_8_ = (ulong)((byte)(uVar41 >> 2) & 1) * auVar56._16_8_;
      auVar82._24_8_ = (uVar41 >> 3) * auVar56._24_8_;
      auVar52 = vpternlogq_avx512vl(auVar82,auVar52,auVar51,0xf8);
      auVar52 = vmovdqu64_avx512vl(auVar52);
      *(undefined1 (*) [32])((long)puVar33 + uVar26) = auVar52;
      auVar58 = vpaddq_avx2(auVar58,auVar103);
      uVar26 = uVar26 + 0x20;
    } while ((lVar31 * 8 & 0xffffffffffffffe0U) != uVar26);
    lVar20 = lVar20 + 1;
    lVar31 = lVar31 + -1;
    uVar26 = uVar40;
  } while (lVar20 != 0x40);
  goto LAB_00104d1a;
LAB_00105f34:
  do {
    if (puVar25 == (pointer)local_31f8._0_8_) goto LAB_00105fa2;
    uVar41 = uVar26 - 0x40;
    if (uVar26 < 0x40) {
      uVar41 = uVar26;
    }
    uVar32 = 0;
    do {
      pvVar35 = &local_3158;
      if (uVar26 < 0x40) {
        pvVar35 = &local_3278;
      }
      local_3260.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[uVar32 + uVar26 * uVar27] =
           ((pvVar35->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start[uVar32] >> (uVar41 & 0x3f) & 1) != 0;
      uVar32 = uVar32 + 1;
    } while ((uVar32 & 0xffffffff) < uVar27);
    *(undefined1 *)((long)__s + uVar26 * 0x81) = 1;
    uVar26 = uVar26 + 1;
  } while (uVar26 != 0x80);
  uVar26 = 0;
  local_31f8._0_4_ = 1;
  uVar19 = 0;
  do {
    if (uVar19 < 0x80) {
      uVar32 = (ulong)uVar19;
      uVar34 = uVar32 << 7;
      lVar20 = uVar27 * uVar32;
      puVar37 = local_3260.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                .super__Vector_impl_data._M_start + uVar26 + lVar20;
      iVar18 = 0;
      uVar41 = uVar32;
      do {
        if (*puVar37 != '\0') {
          if (iVar18 != 0) {
            if (uVar26 < uVar27) {
              lVar31 = (uVar41 & 0xffffffff) * uVar27;
              uVar41 = uVar26;
              uVar28 = local_31f8._0_4_;
              do {
                uVar2 = local_3260.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar41 + lVar20];
                local_3260.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                .super__Vector_impl_data._M_start[uVar41 + lVar20] =
                     local_3260.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar41 + lVar31];
                local_3260.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                .super__Vector_impl_data._M_start[uVar41 + lVar31] = uVar2;
                uVar41 = (ulong)uVar28;
                uVar28 = uVar28 + 1;
              } while (uVar41 < uVar27);
            }
            lVar20 = 0;
            do {
              uVar3 = *(undefined1 *)((long)__s + lVar20 + uVar32 * 0x80);
              *(undefined1 *)((long)__s + lVar20 + uVar32 * 0x80) =
                   *(undefined1 *)((long)__s + lVar20 + (uVar34 & 0xffffffff));
              *(undefined1 *)((long)__s + lVar20 + (uVar34 & 0xffffffff)) = uVar3;
              lVar20 = lVar20 + 1;
            } while (lVar20 != 0x80);
          }
          goto LAB_001060bc;
        }
        uVar41 = uVar41 + 1;
        uVar34 = uVar34 + 0x80;
        iVar18 = iVar18 + -1;
        puVar37 = puVar37 + uVar27;
        uVar28 = uVar19;
      } while ((int)uVar41 != 0x80);
    }
    else {
      uVar28 = 0x80;
      if (uVar19 != 0x80) {
LAB_001060bc:
        uVar28 = uVar19 + 1;
        if (uVar28 < 0x80) {
          uVar41 = (ulong)uVar28;
          pvVar36 = (void *)(uVar41 * 0x80 + (long)__s);
          do {
            uVar32 = uVar26;
            uVar7 = local_31f8._0_4_;
            if (local_3260.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                .super__Vector_impl_data._M_start[uVar26 + uVar41 * uVar27] != '\0') {
              while (uVar32 < uVar27) {
                local_3260.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                .super__Vector_impl_data._M_start[uVar32 + uVar41 * uVar27] =
                     local_3260.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar32 + uVar41 * uVar27] ^
                     local_3260.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar32 + uVar19 * uVar27];
                uVar32 = (ulong)uVar7;
                uVar7 = uVar7 + 1;
              }
              lVar20 = 0;
              do {
                *(byte *)((long)pvVar36 + lVar20) =
                     *(byte *)((long)pvVar36 + lVar20) ^
                     *(byte *)((long)__s + lVar20 + (ulong)(uVar19 << 7));
                lVar20 = lVar20 + 1;
              } while (lVar20 != 0x80);
            }
            uVar41 = uVar41 + 1;
            pvVar36 = (void *)((long)pvVar36 + 0x80);
          } while ((int)uVar41 != 0x80);
        }
      }
    }
    uVar19 = uVar28;
    uVar26 = uVar26 + 1;
    local_31f8._0_4_ = local_31f8._0_4_ + 1;
  } while ((uVar26 & 0xffffffff) < uVar27);
  goto LAB_00106179;
LAB_00105fa2:
  *(undefined1 *)((long)__s + uVar26 * 0x81) = 1;
  uVar26 = uVar26 + 1;
  if (uVar26 == 0x80) goto code_r0x00105fbc;
  goto LAB_00105f34;
code_r0x00105fbc:
  uVar19 = 0;
LAB_00106179:
  if (local_3260.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_3260.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    memset(local_3260.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start,0,
           (long)local_3260.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)local_3260.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start);
  }
  if (uVar19 < 0x80) {
    uVar26 = (ulong)uVar19;
    lVar20 = uVar40 * uVar26;
    do {
      uVar27 = 0;
      do {
        if ((local_31a0 != local_3198) && (*(char *)((long)__s + uVar27 + uVar26 * 0x80) != '\0')) {
          uVar41 = uVar27 - 0x40;
          if (uVar27 < 0x40) {
            uVar41 = uVar27;
          }
          uVar32 = 0;
          do {
            pvVar35 = &local_32b8;
            if (uVar27 < 0x40) {
              pvVar35 = &local_3228;
            }
            local_3260.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start[uVar32 + lVar20] =
                 local_3260.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar32 + lVar20] ^
                 ((pvVar35->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_start[uVar32] >> (uVar41 & 0x3f) & 1) != 0;
            uVar32 = uVar32 + 1;
          } while ((uVar32 & 0xffffffff) < uVar40);
        }
        uVar27 = uVar27 + 1;
      } while (uVar27 != 0x80);
      uVar26 = uVar26 + 1;
      lVar20 = lVar20 + uVar40;
    } while (uVar26 != 0x80);
  }
  local_3178 = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_3170,uVar40,&local_3178,&local_32b9);
  lVar20 = 0;
  auVar50._28_4_ = 0;
  auVar50._0_28_ = local_31f8._4_28_;
  local_31f8 = auVar50 << 0x20;
  puVar37 = local_3260.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start;
  do {
    if (local_31a0 != local_3198) {
      uVar26 = 1;
      uVar27 = 0;
      do {
        uVar41 = uVar26;
        if (local_3260.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start[uVar27 + lVar20 * uVar40] != '\0') {
          if ((uint)local_31f8._0_4_ < 0x40) {
            uVar26 = 0;
            do {
              puVar1 = (ulong *)(CONCAT71(local_3170.
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                          local_3170.
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_start._0_1_) +
                                uVar26 * 8);
              *puVar1 = *puVar1 | (ulong)puVar37[uVar26] << ((ulong)(uint)local_31f8._0_4_ & 0x3f);
              uVar26 = uVar26 + 1;
            } while ((uVar26 & 0xffffffff) < uVar40);
            local_31f8._0_4_ = local_31f8._0_4_ + 1;
          }
          break;
        }
        uVar26 = (ulong)((int)uVar41 + 1);
        uVar27 = uVar41;
      } while (uVar41 < uVar40);
    }
    lVar20 = lVar20 + 1;
    puVar37 = puVar37 + uVar40;
  } while (lVar20 != 0x80);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Returning ",10);
  poVar22 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar22," of ",4);
  poVar22 = std::ostream::_M_insert<unsigned_long>((ulong)poVar22);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar22," non-zero nullspace vectors retrieved within ",0x2d);
  poVar22 = std::ostream::_M_insert<unsigned_long>((ulong)poVar22);
  std::__ostream_insert<char,std::char_traits<char>>(poVar22," candidates.",0xc);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar22 + -0x18) + (char)poVar22);
  std::ostream::put((char)poVar22);
  std::ostream::flush();
  local_3138 = local_31f8._0_4_;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_3130,&local_3170);
  pvVar36 = (void *)CONCAT71(local_3170.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start._1_7_,
                             local_3170.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start._0_1_);
  if (pvVar36 != (void *)0x0) {
    operator_delete(pvVar36,(long)local_3170.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar36)
    ;
  }
  operator_delete(__s,0x4000);
  if (local_3260.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3260.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_3260.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_3260.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  __blanczos_matrix::sparse::multiply_regular(&local_3108,&local_3278,&local_3130,nthreads);
  uVar30 = local_3138;
  for (puVar25 = local_3278.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      puVar25 !=
      local_3278.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish; puVar25 = puVar25 + 1) {
    if (*puVar25 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"The nullspace is incorrect.",0x1b);
      std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
      exit(0xd);
    }
  }
  if (local_31a8 != 0) {
    uVar26 = 0;
    do {
      if ((ulong)local_3108.colmap.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar26] == 0xffffffff) {
        uVar29 = 0;
      }
      else {
        uVar29 = local_3130.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start
                 [local_3108.colmap.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar26]];
      }
      local_3140[uVar26] = uVar29;
      uVar26 = uVar26 + 1;
    } while (local_31a8 != uVar26);
  }
  if (local_3130.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3130.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_3130.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_3130.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
LAB_00105cac:
  if (local_3158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_3158.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_3158.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_3278.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3278.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_3278.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_3278.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
      local_31c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0) {
    operator_delete(local_31c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_31c0.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_31c0.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((_anonymous_namespace_ *)
      local_3298.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (_anonymous_namespace_ *)0x0) {
    operator_delete(local_3298.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_3298.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_3298.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_3210.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3210.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_3210.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_3210.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((_anonymous_namespace_ *)
      local_31d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (_anonymous_namespace_ *)0x0) {
    operator_delete(local_31d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_31d8.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_31d8.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((_anonymous_namespace_ *)
      local_3248.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (_anonymous_namespace_ *)0x0) {
    operator_delete(local_3248.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_3248.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_3248.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((_anonymous_namespace_ *)
      local_32b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (_anonymous_namespace_ *)0x0) {
    operator_delete(local_32b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_32b8.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_32b8.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_3190.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3190.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_3190.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_3190.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (uVar30 == 0xffffffff) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Need to restart Lanczos.",0x18);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
    std::ostream::put(-0x38);
    std::ostream::flush();
  }
  if (local_3228.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (result_type *)0x0) {
    operator_delete(local_3228.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_3228.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_3228.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::random_device::_M_fini();
  if (uVar30 != 0xffffffff) {
    __blanczos_matrix::sparse::~sparse(&local_3108);
    return uVar30;
  }
  goto LAB_001046eb;
}

Assistant:

uint32_t blanczos(const uint32_t * B, const uint64_t N, const uint32_t Nrow, const uint32_t Ncol, uint64_t * result)
{
    const uint32_t nthreads = std::max(1U, std::thread::hardware_concurrency());
    constexpr double cache = 512.0 * 1024.0; // Blocks capped at 512 KB.

    if (Ncol < Nrow + 64U)
    {
        std::cerr << "Ncol >= Nrow + 64 is expected." << std::endl;
        exit(17);
    }

    const __blanczos_matrix::sparse matrix = __blanczos_matrix::sparse(B, N, Nrow, Ncol, cache);

    uint32_t Nsol = UINT32_MAX;
    while (Nsol == UINT32_MAX)
    {
        std::random_device rd;
        std::mt19937_64 gen(rd());
        std::uniform_int_distribution<uint64_t> dis(0U, UINT64_MAX);

        vec64 X = vec64(matrix.Kcol(), 0U);
        for (uint64_t & elem : X)
            elem = dis(gen);

        Nsol = runner(matrix, X, result, nthreads);
        if (Nsol == UINT32_MAX)
            std::cout << "Need to restart Lanczos." << std::endl;
    }
    return Nsol;
}